

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

double __thiscall wasm::Literal::copysign(Literal *this,double __x,double __y)

{
  BasicType BVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  anon_union_16_5_9943fe1e_for_Literal_0 local_38;
  undefined8 local_28;
  
  BVar1 = wasm::Type::getBasic((Type *)(in_RSI + 2));
  if (BVar1 == f64) {
    local_38.func.super_IString.str._M_len =
         *in_RDX & 0x8000000000000000 | *in_RSI & 0x7fffffffffffffff;
    local_28 = 3;
    castToF64(this,(Literal *)&local_38.func);
  }
  else {
    if (BVar1 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x627);
    }
    local_38.i32 = (uint)*in_RDX & 0x80000000 | (uint)*in_RSI & 0x7fffffff;
    local_28 = 2;
    castToF32(this,(Literal *)&local_38.func);
  }
  ~Literal((Literal *)&local_38.func);
  return extraout_XMM0_Qa;
}

Assistant:

Literal Literal::copysign(const Literal& other) const {
  // operate on bits directly, to avoid signalling bit being set on a float
  switch (type.getBasic()) {
    case Type::f32:
      return Literal((i32 & 0x7fffffff) | (other.i32 & 0x80000000)).castToF32();
      break;
    case Type::f64:
      return Literal((i64 & 0x7fffffffffffffffUL) |
                     (other.i64 & 0x8000000000000000UL))
        .castToF64();
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}